

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_pack(REF_GEOM ref_geom,REF_INT *o2n)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_28;
  REF_INT i;
  REF_INT compact;
  REF_INT geom;
  REF_INT *o2n_local;
  REF_GEOM ref_geom_local;
  
  local_28 = 0;
  for (i = 0; i < ref_geom->max; i = i + 1) {
    if (ref_geom->descr[i * 6] != -1) {
      for (ref_private_status_reis_ai._4_4_ = 0; ref_private_status_reis_ai._4_4_ < 6;
          ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
        ref_geom->descr[ref_private_status_reis_ai._4_4_ + local_28 * 6] =
             ref_geom->descr[ref_private_status_reis_ai._4_4_ + i * 6];
      }
      ref_geom->descr[local_28 * 6 + 5] = o2n[ref_geom->descr[i * 6 + 5]];
      for (ref_private_status_reis_ai._4_4_ = 0; ref_private_status_reis_ai._4_4_ < 2;
          ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
        ref_geom->param[ref_private_status_reis_ai._4_4_ + local_28 * 2] =
             ref_geom->param[ref_private_status_reis_ai._4_4_ + i * 2];
      }
      local_28 = local_28 + 1;
    }
  }
  if ((long)local_28 == (long)ref_geom->n) {
    if (ref_geom->n < ref_geom->max) {
      for (i = ref_geom->n; i < ref_geom->max; i = i + 1) {
        ref_geom->descr[i * 6] = -1;
        ref_geom->descr[i * 6 + 1] = i + 1;
      }
      ref_geom->descr[(ref_geom->max + -1) * 6 + 1] = -1;
      ref_geom->blank = ref_geom->n;
    }
    else {
      ref_geom->blank = -1;
    }
    ref_geom_local._4_4_ = ref_adj_free(ref_geom->ref_adj);
    if (ref_geom_local._4_4_ == 0) {
      ref_geom_local._4_4_ = ref_adj_create(&ref_geom->ref_adj);
      if (ref_geom_local._4_4_ == 0) {
        for (i = 0; i < ref_geom->max; i = i + 1) {
          if ((ref_geom->descr[i * 6] != -1) &&
             (uVar1 = ref_adj_add(ref_geom->ref_adj,ref_geom->descr[i * 6 + 5],i), uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xf5,"ref_geom_pack",(ulong)uVar1,"register geom");
            return uVar1;
          }
        }
        ref_geom_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf1
               ,"ref_geom_pack",(ulong)ref_geom_local._4_4_,"create ref_adj for ref_geom");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf0,
             "ref_geom_pack",(ulong)ref_geom_local._4_4_,"free to prevent leak");
    }
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe5,
           "ref_geom_pack","count mismatch",(long)local_28,(long)ref_geom->n);
    ref_geom_local._4_4_ = 1;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_pack(REF_GEOM ref_geom, REF_INT *o2n) {
  REF_INT geom, compact, i;
  compact = 0;
  each_ref_geom(ref_geom, geom) {
    for (i = 0; i < REF_GEOM_DESCR_SIZE; i++)
      ref_geom_descr(ref_geom, i, compact) = ref_geom_descr(ref_geom, i, geom);
    ref_geom_node(ref_geom, compact) = o2n[ref_geom_node(ref_geom, geom)];
    for (i = 0; i < 2; i++)
      ref_geom_param(ref_geom, i, compact) = ref_geom_param(ref_geom, i, geom);
    compact++;
  }
  REIS(compact, ref_geom_n(ref_geom), "count mismatch");
  if (ref_geom_n(ref_geom) < ref_geom_max(ref_geom)) {
    for (geom = ref_geom_n(ref_geom); geom < ref_geom_max(ref_geom); geom++) {
      ref_geom_type(ref_geom, geom) = REF_EMPTY;
      ref_geom_id(ref_geom, geom) = geom + 1;
    }
    ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
    ref_geom_blank(ref_geom) = ref_geom_n(ref_geom);
  } else {
    ref_geom_blank(ref_geom) = REF_EMPTY;
  }
  RSS(ref_adj_free(ref_geom->ref_adj), "free to prevent leak");
  RSS(ref_adj_create(&(ref_geom->ref_adj)), "create ref_adj for ref_geom");

  each_ref_geom(ref_geom, geom) {
    RSS(ref_adj_add(ref_geom->ref_adj, ref_geom_node(ref_geom, geom), geom),
        "register geom");
  }

  return REF_SUCCESS;
}